

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_tableref.cpp
# Opt level: O1

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::Transformer::TransformTableRefNode(Transformer *this,PGNode *n)

{
  PGNodeTag PVar1;
  NotImplementedException *this_00;
  PGNodeTag *in_RDX;
  StackChecker<duckdb::Transformer> stack_checker;
  undefined1 local_50 [16];
  string local_40;
  
  StackCheck((Transformer *)local_50,(idx_t)n);
  PVar1 = *in_RDX;
  if ((int)PVar1 < 0x94) {
    if (PVar1 == T_PGRangeVar) {
      TransformRangeVar(this,(PGRangeVar *)n);
    }
    else {
      if (PVar1 != T_PGJoinExpr) {
LAB_00ebf242:
        this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_50 + 0x10),"From Type %d not supported","");
        NotImplementedException::NotImplementedException<duckdb_libpgquery::PGNodeTag>
                  (this_00,(string *)(local_50 + 0x10),*in_RDX);
        __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      TransformJoin(this,(PGJoinExpr *)n);
    }
  }
  else if (PVar1 == T_PGPivotExpr) {
    TransformPivot(this,(PGPivotExpr *)n);
  }
  else if (PVar1 == T_PGRangeSubselect) {
    TransformRangeSubselect(this,(PGRangeSubselect *)n);
  }
  else {
    if (PVar1 != T_PGRangeFunction) goto LAB_00ebf242;
    TransformRangeFunction(this,(PGRangeFunction *)n);
  }
  *(idx_t *)(local_50._0_8_ + 200) = *(idx_t *)(local_50._0_8_ + 200) - local_50._8_8_;
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

unique_ptr<TableRef> Transformer::TransformTableRefNode(duckdb_libpgquery::PGNode &n) {
	auto stack_checker = StackCheck();

	switch (n.type) {
	case duckdb_libpgquery::T_PGRangeVar:
		return TransformRangeVar(PGCast<duckdb_libpgquery::PGRangeVar>(n));
	case duckdb_libpgquery::T_PGJoinExpr:
		return TransformJoin(PGCast<duckdb_libpgquery::PGJoinExpr>(n));
	case duckdb_libpgquery::T_PGRangeSubselect:
		return TransformRangeSubselect(PGCast<duckdb_libpgquery::PGRangeSubselect>(n));
	case duckdb_libpgquery::T_PGRangeFunction:
		return TransformRangeFunction(PGCast<duckdb_libpgquery::PGRangeFunction>(n));
	case duckdb_libpgquery::T_PGPivotExpr:
		return TransformPivot(PGCast<duckdb_libpgquery::PGPivotExpr>(n));
	default:
		throw NotImplementedException("From Type %d not supported", n.type);
	}
}